

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.h
# Opt level: O1

void set_header_add(FIOBJ hash,FIOBJ name,FIOBJ value)

{
  int *piVar1;
  FIOBJ FVar2;
  FIOBJ ary;
  size_t sVar3;
  ulong pos;
  
  FVar2 = fiobj_hash_replace(hash,name,value);
  if (FVar2 == 0) {
    return;
  }
  if (value != 0) {
    if (((~(uint)FVar2 & 6) == 0 || (FVar2 & 1) != 0) ||
       (ary = FVar2, *(char *)(FVar2 & 0xfffffffffffffff8) != ')')) {
      ary = fiobj_ary_new();
      fiobj_ary_push(ary,FVar2);
    }
    if (((~(uint)value & 6) != 0 && (value & 1) == 0) &&
       (*(char *)(value & 0xfffffffffffffff8) == ')')) {
      sVar3 = fiobj_ary_count(value);
      if (sVar3 != 0) {
        pos = 0;
        do {
          FVar2 = fiobj_ary_index(value,pos);
          if ((((~(uint)FVar2 & 6) != 0) && (FVar2 != 0)) && ((FVar2 & 1) == 0)) {
            LOCK();
            piVar1 = (int *)((FVar2 & 0xfffffffffffffff8) + 4);
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          fiobj_ary_push(ary,FVar2);
          pos = pos + 1;
          sVar3 = fiobj_ary_count(value);
        } while (pos < sVar3);
      }
      fiobj_hash_set(hash,name,ary);
      return;
    }
    fiobj_ary_push(ary,value);
    fiobj_hash_replace(hash,name,ary);
    return;
  }
  fiobj_free(FVar2);
  return;
}

Assistant:

static inline void set_header_add(FIOBJ hash, FIOBJ name, FIOBJ value) {
  FIOBJ old = fiobj_hash_replace(hash, name, value);
  if (!old)
    return;
  if (!value) {
    fiobj_free(old);
    return;
  }
  if (!FIOBJ_TYPE_IS(old, FIOBJ_T_ARRAY)) {
    FIOBJ tmp = fiobj_ary_new();
    fiobj_ary_push(tmp, old);
    old = tmp;
  }
  if (FIOBJ_TYPE_IS(value, FIOBJ_T_ARRAY)) {
    for (size_t i = 0; i < fiobj_ary_count(value); ++i) {
      fiobj_ary_push(old, fiobj_dup(fiobj_ary_index(value, i)));
    }
    /* frees `value` */
    fiobj_hash_set(hash, name, old);
    return;
  }
  /* value will be owned by both hash and array */
  fiobj_ary_push(old, value);
  /* don't free `value` (leave in array) */
  fiobj_hash_replace(hash, name, old);
}